

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

bool cfd::core::RandomNumberUtil::GetRandomBool(vector<bool,_std::allocator<bool>_> *random_cache)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  result_type rVar4;
  undefined8 uVar5;
  result_type_conflict rVar6;
  _Bit_reference in_stack_ffffffffffffffa0;
  undefined2 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb2;
  undefined1 in_stack_ffffffffffffffb3;
  undefined4 in_stack_ffffffffffffffb4;
  bool ret;
  bool value;
  int i;
  uint32_t random;
  vector<bool,_std::allocator<bool>_> *local_10;
  vector<bool,_std::allocator<bool>_> *random_cache_local;
  
  local_10 = random_cache;
  if ((GetRandomBool(std::vector<bool,std::allocator<bool>>*)::rd == '\0') &&
     (iVar3 = __cxa_guard_acquire(&GetRandomBool(std::vector<bool,std::allocator<bool>>*)::rd),
     iVar3 != 0)) {
    std::random_device::random_device(&GetRandomBool::rd);
    __cxa_atexit(std::random_device::~random_device,&GetRandomBool::rd,&__dso_handle);
    __cxa_guard_release(&GetRandomBool(std::vector<bool,std::allocator<bool>>*)::rd);
  }
  if ((GetRandomBool(std::vector<bool,std::allocator<bool>>*)::engine == '\0') &&
     (iVar3 = __cxa_guard_acquire(&GetRandomBool(std::vector<bool,std::allocator<bool>>*)::engine),
     iVar3 != 0)) {
    rVar4 = std::random_device::operator()(&GetRandomBool::rd);
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::mersenne_twister_engine(&GetRandomBool::engine,(ulong)rVar4);
    __cxa_guard_release(&GetRandomBool(std::vector<bool,std::allocator<bool>>*)::engine);
  }
  if (local_10 != (vector<bool,_std::allocator<bool>_> *)0x0) {
    bVar1 = std::vector<bool,_std::allocator<bool>_>::empty(local_10);
    if (bVar1) {
      rVar6 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(&GetRandomBool::engine);
      for (iVar3 = 0; iVar3 < 0x20; iVar3 = iVar3 + 1) {
        std::vector<bool,_std::allocator<bool>_>::push_back
                  (local_10,((uint)rVar6 >> ((byte)iVar3 & 0x1f) & 1) != 0);
      }
    }
    std::vector<bool,_std::allocator<bool>_>::back(local_10);
    bVar2 = ::std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&stack0xffffffffffffffa0)
    ;
    std::vector<bool,_std::allocator<bool>_>::pop_back(local_10);
    return (bool)(bVar2 & 1);
  }
  i._2_1_ = 1;
  uVar5 = __cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&random,"GetRandomBool error.",(allocator *)((long)&i + 3));
  CfdException::CfdException
            ((CfdException *)
             CONCAT44(in_stack_ffffffffffffffb4,
                      CONCAT13(in_stack_ffffffffffffffb3,
                               CONCAT12(in_stack_ffffffffffffffb2,in_stack_ffffffffffffffb0))),
             in_stack_ffffffffffffffa0._M_mask._4_4_,(string *)in_stack_ffffffffffffffa0._M_p);
  i._2_1_ = 0;
  __cxa_throw(uVar5,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

bool RandomNumberUtil::GetRandomBool(std::vector<bool> *random_cache) {
#if defined(_WIN32) && defined(__GNUC__) && (__GNUC__ < 9)
  // for mingw gcc lower 9
  static std::mt19937 engine(static_cast<unsigned int>(time(nullptr)));
#else
  static std::random_device rd;
  static std::mt19937 engine(rd());
#endif
  if (random_cache == nullptr) {
    throw CfdException(kCfdIllegalArgumentError, "GetRandomBool error.");
  }

  if (random_cache->empty()) {
    uint32_t random = engine();
    for (int i = 0; i < 32; i++) {
      bool value = (random >> i) & 1;
      random_cache->push_back(value);
    }
  }
  bool ret = random_cache->back();
  random_cache->pop_back();
  return ret;
}